

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error assemble_int(context *ctx,opcode *op,token *token,int bits,int address)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  byte in_R9B;
  token local_98;
  ulong local_70;
  uint64_t raw;
  byte local_51;
  ulong local_50;
  uint64_t value;
  int64_t max;
  int64_t min;
  byte local_30;
  int raw_bits;
  int address_local;
  int bits_local;
  token *token_local;
  opcode *op_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  _address_local = (void *)CONCAT44(in_register_0000000c,bits);
  min._4_4_ = address + -1;
  max = -(1L << ((byte)min._4_4_ & 0x3f));
  value = (1L << ((byte)min._4_4_ & 0x3f)) + -1;
  local_51 = 0;
  raw_bits = address;
  token_local = token;
  op_local = op;
  ctx_local = ctx;
  local_30 = in_R9B;
  convert_integer((token *)ctx,(int64_t)_address_local,max,(uint64_t *)value);
  bVar1 = error::operator_cast_to_bool((error *)ctx);
  if (bVar1) {
    local_51 = 1;
  }
  raw._0_4_ = (uint)bVar1;
  if ((local_51 & 1) == 0) {
    error::~error((error *)ctx);
  }
  if ((uint)raw == 0) {
    local_70 = local_50 & (1L << ((byte)raw_bits & 0x3f)) - 1U;
    opcode::add_bits((opcode *)token_local,local_70 << (local_30 & 0x3f));
    context::tokenize(&local_98,(context *)op_local);
    memcpy(_address_local,&local_98,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

inline error assemble_int(context& ctx, opcode& op, token& token, int bits, int address)
{
    const int raw_bits = bits - 1;
    const int64_t min = -(1LL << raw_bits);
    const int64_t max = (1LL << raw_bits) - 1;
    uint64_t value;
    CHECK(convert_integer(token, min, max, &value));
    const uint64_t raw = value & ((1ULL << bits) - 1);
    op.add_bits(raw << address);
    token = ctx.tokenize();
    return {};
}